

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movieTickets.cpp
# Opt level: O1

void getInput(string *movieName,double *adultTicketPrice,double *childTicketPrice,
             int *noOfAdultTicketSold,int *noOfChildTicketSold,double *percentageDonation)

{
  char cVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Name of the movie: ",0x13);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)movieName,cVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Adult ticket price: ",0x14);
  std::istream::_M_extract<double>((double *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Child ticket price: ",0x14);
  std::istream::_M_extract<double>((double *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of adult tickets sold: ",0x1e);
  std::istream::operator>>((istream *)&std::cin,noOfAdultTicketSold);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of child tickets sold: ",0x1e);
  std::istream::operator>>((istream *)&std::cin,noOfChildTicketSold);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Gross percentage that you would like to donate: ",0x30);
  std::istream::_M_extract<double>((double *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

void getInput(string& movieName, double& adultTicketPrice,
              double& childTicketPrice, int& noOfAdultTicketSold,
              int& noOfChildTicketSold, double& percentageDonation) {

    cout << "Name of the movie: ";
    getline(cin, movieName);
    cout << endl;

    cout << "Adult ticket price: ";
    cin >> adultTicketPrice;
    cout << endl;

    cout << "Child ticket price: ";
    cin >> childTicketPrice;
    cout << endl;

    cout << "Number of adult tickets sold: ";
    cin >> noOfAdultTicketSold;
    cout << endl;

    cout << "Number of child tickets sold: ";
    cin >> noOfChildTicketSold;
    cout << endl;

    cout << "Gross percentage that you would like to donate: ";
    cin >> percentageDonation;
    cout << endl;

}